

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::Clear(cmDepends *this,string *file)

{
  undefined1 local_2b0 [8];
  cmGeneratedFileStream depFileStream;
  string local_38;
  string *local_18;
  string *file_local;
  cmDepends *this_local;
  
  local_18 = file;
  file_local = (string *)this;
  if ((this->Verbose & 1U) != 0) {
    cmStrCat<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
              (&local_38,(char (*) [27])"Clearing dependencies in \"",file,(char (*) [4])0x1145e39);
    cmSystemTools::Stdout(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2b0,local_18,false,None);
  std::operator<<((ostream *)local_2b0,
                  "# Empty dependencies file\n# This may be replaced when dependencies are built.\n"
                 );
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  return;
}

Assistant:

void cmDepends::Clear(const std::string& file) const
{
  // Print verbose output.
  if (this->Verbose) {
    cmSystemTools::Stdout(
      cmStrCat("Clearing dependencies in \"", file, "\".\n"));
  }

  // Write an empty dependency file.
  cmGeneratedFileStream depFileStream(file);
  depFileStream << "# Empty dependencies file\n"
                   "# This may be replaced when dependencies are built.\n";
}